

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ExpandMacroResult __thiscall
anon_unknown.dwarf_72f84b::EnvironmentMacroExpander<cmCMakePresetsGraph::ConfigurePreset>::
operator()(EnvironmentMacroExpander<cmCMakePresetsGraph::ConfigurePreset> *this,
          string *macroNamespace,string *macroName,string *macroOut,int version)

{
  MacroExpanderVector *macroExpanders;
  bool bVar1;
  int iVar2;
  ExpandMacroResult EVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_58;
  bool local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)macroNamespace);
  if (((iVar2 == 0) && (macroName->_M_string_length != 0)) &&
     ((this->Out->super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
      _M_payload.super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_engaged == true)) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(this->Out->
                    super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
                    _M_payload.
                    super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                    .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_payload.
                    _M_value.super_Preset.Environment._M_t,macroName);
    p_Var6 = (_Base_ptr)
             ((long)&(this->Out->
                     super__Optional_base<cmCMakePresetsGraph::ConfigurePreset,_false,_false>).
                     _M_payload.
                     super__Optional_payload<cmCMakePresetsGraph::ConfigurePreset,_true,_false,_false>
                     .super__Optional_payload_base<cmCMakePresetsGraph::ConfigurePreset>._M_payload
             + 0xb0);
    bVar1 = true;
    if ((iVar4._M_node != p_Var6) && ((char)iVar4._M_node[3]._M_color == _S_black)) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[](this->EnvCycles,macroName);
      p_Var6 = (_Base_ptr)0x0;
      if (*pmVar5 != Verified) {
        if (*pmVar5 == InProgress) {
          p_Var6 = (_Base_ptr)0x2;
        }
        else {
          macroExpanders = this->MacroExpanders;
          *pmVar5 = InProgress;
          EVar3 = cmCMakePresetsGraphInternal::ExpandMacros
                            ((string *)(iVar4._M_node + 2),macroExpanders,version);
          p_Var6 = (_Base_ptr)(ulong)EVar3;
          if (EVar3 == Ok) {
            *pmVar5 = Verified;
            p_Var6 = (_Base_ptr)0x0;
          }
        }
      }
      bVar1 = false;
      if ((int)p_Var6 == 0) {
        std::__cxx11::string::_M_append((char *)macroOut,*(ulong *)(iVar4._M_node + 2));
        p_Var6 = (_Base_ptr)0x0;
      }
    }
    if (!bVar1) {
      return (ExpandMacroResult)p_Var6;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)macroNamespace);
  if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)macroNamespace), iVar2 != 0)) {
    return Ignore;
  }
  if (macroName->_M_string_length == 0) {
    EVar3 = Error;
  }
  else {
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58,macroName);
    if (local_38 == true) {
      std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_58._M_value._M_dataplus._M_p);
    }
    if ((local_38 == true) &&
       (local_38 = false,
       local_58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_58._M_value + 0x10))) {
      operator_delete((void *)local_58._M_value._M_dataplus._M_p,local_58._16_8_ + 1);
    }
    EVar3 = Ok;
  }
  return EVar3;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int version) const override
  {
    if (macroNamespace == "env" && !macroName.empty() && Out) {
      auto v = Out->Environment.find(macroName);
      if (v != Out->Environment.end() && v->second) {
        auto e =
          VisitEnv(*v->second, EnvCycles[macroName], MacroExpanders, version);
        if (e != ExpandMacroResult::Ok) {
          return e;
        }
        macroOut += *v->second;
        return ExpandMacroResult::Ok;
      }
    }

    if (macroNamespace == "env" || macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }